

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::prep_in_buffer(jpeg_decoder *this)

{
  int iVar1;
  jpeg_decoder *in_RDI;
  int bytes_read;
  jpgd_status in_stack_ffffffffffffffdc;
  undefined7 in_stack_ffffffffffffffe0;
  byte in_stack_ffffffffffffffe7;
  
  in_RDI->m_in_buf_left = 0;
  in_RDI->m_pIn_buf_ofs = in_RDI->m_in_buf;
  if ((in_RDI->m_eof_flag & 1U) == 0) {
    do {
      iVar1 = (*in_RDI->m_pStream->_vptr_jpeg_decoder_stream[2])
                        (in_RDI->m_pStream,in_RDI->m_in_buf + in_RDI->m_in_buf_left,
                         (ulong)(0x2000 - in_RDI->m_in_buf_left),&in_RDI->m_eof_flag);
      if (iVar1 == -1) {
        stop_decoding((jpeg_decoder *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
      }
      in_RDI->m_in_buf_left = iVar1 + in_RDI->m_in_buf_left;
      in_stack_ffffffffffffffe7 = 0;
      if (in_RDI->m_in_buf_left < 0x2000) {
        in_stack_ffffffffffffffe7 = in_RDI->m_eof_flag ^ 0xff;
      }
    } while ((in_stack_ffffffffffffffe7 & 1) != 0);
    in_RDI->m_total_bytes_read = in_RDI->m_in_buf_left + in_RDI->m_total_bytes_read;
    word_clear(in_RDI,in_RDI->m_pIn_buf_ofs + in_RDI->m_in_buf_left,0xd9ff,0x40);
  }
  return;
}

Assistant:

void jpeg_decoder::prep_in_buffer()
	{
		m_in_buf_left = 0;
		m_pIn_buf_ofs = m_in_buf;

		if (m_eof_flag)
			return;

		do
		{
			int bytes_read = m_pStream->read(m_in_buf + m_in_buf_left, JPGD_IN_BUF_SIZE - m_in_buf_left, &m_eof_flag);
			if (bytes_read == -1)
				stop_decoding(JPGD_STREAM_READ);

			m_in_buf_left += bytes_read;
		} while ((m_in_buf_left < JPGD_IN_BUF_SIZE) && (!m_eof_flag));

		m_total_bytes_read += m_in_buf_left;

		// Pad the end of the block with M_EOI (prevents the decompressor from going off the rails if the stream is invalid).
		// (This dates way back to when this decompressor was written in C/asm, and the all-asm Huffman decoder did some fancy things to increase perf.)
		word_clear(m_pIn_buf_ofs + m_in_buf_left, 0xD9FF, 64);
	}